

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

SegmentReader * __thiscall capnp::_::ReaderArena::tryGetSegment(ReaderArena *this,SegmentId id)

{
  int iVar1;
  SegmentWordCount SVar2;
  Own<capnp::_::SegmentReader,_std::nullptr_t> *segment;
  undefined4 extraout_var;
  anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_2
  *this_00;
  SegmentReader *pSVar3;
  word *extraout_RDX;
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_> *s;
  ArrayPtr<const_capnp::word> segment_00;
  SegmentId id_local;
  Own<capnp::_::SegmentReader,_std::nullptr_t> local_50;
  long local_40;
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  lock;
  
  if (id.value == 0) {
    if ((this->segment0).ptr.size_ != 0) {
      return &this->segment0;
    }
    return (SegmentReader *)0x0;
  }
  kj::
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  ::lockExclusive((MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
                   *)&lock,&this->moreSegments);
  if (((lock.ptr)->ptr).isSet == true) {
    this_00 = &((lock.ptr)->ptr).field_1;
    kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::
    find<unsigned_int&>((HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>> *)
                        &local_40,(uint *)this_00);
    if (local_40 != 0) {
      pSVar3 = *(SegmentReader **)(local_40 + 8);
      goto LAB_00183b63;
    }
  }
  else {
    this_00 = (anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_2
               *)0x0;
  }
  iVar1 = (*this->message->_vptr_MessageReader[2])(this->message,(ulong)id.value);
  if (extraout_RDX == (word *)0x0) {
    pSVar3 = (SegmentReader *)0x0;
  }
  else {
    segment_00.size_ = (size_t)extraout_RDX;
    segment_00.ptr = extraout_RDX;
    SVar2 = verifySegment((_ *)CONCAT44(extraout_var,iVar1),segment_00);
    if (((lock.ptr)->ptr).isSet == false) {
      this_00 = (anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_2
                 *)kj::_::
                   NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>
                   ::emplace<>(&(lock.ptr)->ptr);
    }
    pSVar3 = (SegmentReader *)operator_new(0x28);
    pSVar3->arena = &this->super_Arena;
    (pSVar3->id).value = id.value;
    (pSVar3->ptr).ptr = (word *)CONCAT44(extraout_var,iVar1);
    (pSVar3->ptr).size_ = (ulong)SVar2;
    pSVar3->readLimiter = &this->readLimiter;
    local_50.disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentReader>::instance;
    local_50.ptr = pSVar3;
    kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>::insert
              (&this_00->value,id.value,&local_50);
    if (local_50.ptr != (SegmentReader *)0x0) {
      local_50.ptr = (SegmentReader *)0x0;
      (**(local_50.disposer)->_vptr_Disposer)();
    }
  }
LAB_00183b63:
  kj::
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  ::~Locked(&lock);
  return pSVar3;
}

Assistant:

SegmentReader* ReaderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArray() == nullptr) {
      return nullptr;
    } else {
      return &segment0;
    }
  }

  auto lock = moreSegments.lockExclusive();

  SegmentMap* segments = nullptr;
  KJ_IF_SOME(s, *lock) {
    KJ_IF_SOME(segment, s.find(id.value)) {
      return segment;
    }
    segments = &s;
  }

  kj::ArrayPtr<const word> newSegment = message->getSegment(id.value);
  if (newSegment == nullptr) {
    return nullptr;
  }

  SegmentWordCount newSegmentSize = verifySegment(newSegment);

  if (*lock == kj::none) {
    // OK, the segment exists, so allocate the map.
    segments = &lock->emplace();
  }

  auto segment = kj::heap<SegmentReader>(
      this, id, newSegment.begin(), newSegmentSize, &readLimiter);
  SegmentReader* result = segment;
  segments->insert(id.value, kj::mv(segment));
  return result;
}